

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  double dVar1;
  char cVar2;
  undefined8 __nptr;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  char *pcVar10;
  anon_union_8_4_dbbb708a_for_data *paVar11;
  char **ppcVar12;
  byte *buffer;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  anon_union_8_4_dbbb708a_for_data *paVar17;
  uint *puVar18;
  anon_union_8_4_dbbb708a_for_data aVar19;
  int *piVar20;
  byte bVar21;
  char *pcVar22;
  size_t maxlength;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  bool bVar28;
  ulong uStack_1600;
  char *local_15e8;
  long local_15e0;
  char *local_15d0;
  _func_int_int_FILE_ptr *local_15c8;
  char *local_15c0;
  ulong local_15b8;
  char **local_15b0;
  char formatbuf [32];
  char work [326];
  va_stack vto [128];
  char *endpos [128];
  
  work._0_8_ = format;
  ppcVar12 = endpos;
  local_15b8 = 0;
  local_15c0 = (char *)0x0;
LAB_004c4022:
  pcVar7 = (char *)(work._0_8_ + 1);
  do {
    pcVar22 = pcVar7;
    if (pcVar22[-1] == '\0') {
      pcVar7 = (char *)0;
      if (0 < (long)local_15c0) {
        pcVar7 = local_15c0;
      }
      paVar11 = &vto[0].data;
      goto LAB_004c457c;
    }
    if (pcVar22[-1] != '%') {
      work._0_8_ = pcVar22;
      goto LAB_004c4022;
    }
    pcVar7 = pcVar22 + 2;
  } while (*pcVar22 == '%');
  uVar24 = (int)local_15b8 + 1;
  local_15c8 = stream;
  local_15b0 = ppcVar12;
  work._0_8_ = pcVar22;
  lVar5 = dprintf_DollarString(pcVar22,(char **)work);
  lVar8 = (long)(int)uVar24;
  if (lVar5 != 0) {
    lVar8 = lVar5;
  }
  if ((long)local_15c0 < lVar8) {
    local_15c0 = (char *)lVar8;
  }
  lVar5 = 0;
  local_15e0 = 0;
  uVar16 = 0;
  local_15b8 = (ulong)uVar24;
  do {
    __nptr = work._0_8_;
    bVar21 = *(byte *)work._0_8_;
    uVar24 = bVar21 - 0x20;
    if (((0x2f < uVar24) || ((0x900003ff6c09U >> ((ulong)uVar24 & 0x3f) & 1) == 0)) &&
       ((0x12 < bVar21 - 0x68 || ((0x40211U >> (bVar21 - 0x68 & 0x1f) & 1) == 0))))
    goto LAB_004c4265;
    work._0_8_ = work._0_8_ + 1;
    switch((ulong)uVar24) {
    case 0:
      uVar16 = uVar16 | 1;
    case 1:
    case 2:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xc:
    case 0xf:
      break;
    case 3:
      uVar16 = uVar16 | 8;
      break;
    case 10:
      uVar16 = uVar16 | 0x4000;
      uVar24 = (int)local_15b8 + 1;
      lVar6 = dprintf_DollarString((char *)work._0_8_,(char **)work);
      lVar5 = (long)(int)uVar24;
      if (lVar6 != 0) {
        lVar5 = lVar6;
      }
      local_15b8 = (ulong)uVar24;
      if ((long)local_15c0 < lVar5) {
        local_15c0 = (char *)lVar5;
      }
      break;
    case 0xb:
      uVar16 = uVar16 | 2;
      break;
    case 0xd:
      uVar16 = uVar16 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*(char *)work._0_8_ == '*') {
        uVar16 = uVar16 | 0x10000;
        work._0_8_ = __nptr + 2;
        uVar24 = (int)local_15b8 + 1;
        lVar6 = dprintf_DollarString((char *)work._0_8_,(char **)work);
        local_15e0 = (long)(int)uVar24;
        if (lVar6 != 0) {
          local_15e0 = lVar6;
        }
        local_15b8 = (ulong)uVar24;
        if ((long)local_15c0 < local_15e0) {
          local_15c0 = (char *)local_15e0;
        }
      }
      else {
        uVar16 = uVar16 | 0x8000;
        local_15e0 = strtol((char *)work._0_8_,(char **)work,10);
      }
      if ((~uVar16 & 0x18000) == 0) {
        return 0;
      }
      break;
    case 0x10:
      uVar16 = uVar16 | (~uVar16 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar16 = uVar16 | 0x2000;
      lVar5 = strtol((char *)__nptr,(char **)work,10);
      break;
    default:
      if (bVar21 == 0x4c) {
        uVar16 = uVar16 | 0x80;
        break;
      }
      if (bVar21 == 0x4f) goto LAB_004c4211;
      if (bVar21 != 0x68) {
        if (bVar21 == 0x6c) {
          if ((uVar16 & 0x20) != 0) goto LAB_004c4219;
        }
        else {
          if (bVar21 == 0x71) {
LAB_004c4219:
            uVar16 = uVar16 | 0x40;
            break;
          }
          if (bVar21 != 0x7a) break;
        }
LAB_004c4211:
        uVar16 = uVar16 | 0x20;
        break;
      }
      uVar16 = uVar16 | 0x10;
    }
  } while( true );
LAB_004c457c:
  bVar27 = pcVar7 == (char *)0x0;
  pcVar7 = (char *)((long)pcVar7 + -1);
  if (bVar27) goto LAB_004c470a;
  uVar24 = *(int *)((long)paVar11 + -0x14);
  if ((uVar24 >> 0xe & 1) != 0) {
    uVar16 = ap_save->gp_offset;
    if ((ulong)uVar16 < 0x29) {
      piVar20 = (int *)((ulong)uVar16 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar16 + 8;
    }
    else {
      piVar20 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar20 + 2;
    }
    vto[*(long *)(paVar11 + -2)].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar20;
  }
  if ((uVar24 >> 0x10 & 1) != 0) {
    uVar16 = ap_save->gp_offset;
    if ((ulong)uVar16 < 0x29) {
      piVar20 = (int *)((ulong)uVar16 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = uVar16 + 8;
    }
    else {
      piVar20 = (int *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = piVar20 + 2;
    }
    vto[*(long *)(paVar11 + -1)].data = (anon_union_8_4_dbbb708a_for_data)(long)*piVar20;
  }
  switch(((va_stack *)(paVar11 + -3))->type) {
  case FORMAT_UNKNOWN:
  case FORMAT_STRING:
  case FORMAT_PTR:
  case FORMAT_INTPTR:
switchD_004c4619_caseD_0:
    uVar25 = (ulong)ap_save->gp_offset;
    if (uVar25 < 0x29) {
LAB_004c4628:
      paVar17 = (anon_union_8_4_dbbb708a_for_data *)(uVar25 + (long)ap_save->reg_save_area);
      ap_save->gp_offset = (int)uVar25 + 8;
    }
    else {
LAB_004c46ba:
      paVar17 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar17 + 1;
    }
    aVar19 = *paVar17;
    goto LAB_004c46c9;
  case FORMAT_INT:
    if ((((~uVar24 & 0x240) == 0) || ((uVar24 & 0x40) != 0)) || ((~uVar24 & 0x220) == 0))
    goto switchD_004c4619_caseD_0;
    uVar16 = ap_save->gp_offset;
    uVar25 = (ulong)uVar16;
    if ((uVar24 & 0x20) != 0) {
      if (0x28 < uVar16) goto LAB_004c46ba;
      goto LAB_004c4628;
    }
    if ((uVar24 >> 9 & 1) == 0) {
      if (uVar16 < 0x29) {
        piVar20 = (int *)(uVar25 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        piVar20 = (int *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = piVar20 + 2;
      }
      aVar19 = (anon_union_8_4_dbbb708a_for_data)(long)*piVar20;
    }
    else {
      if (uVar16 < 0x29) {
        puVar18 = (uint *)(uVar25 + (long)ap_save->reg_save_area);
        ap_save->gp_offset = uVar16 + 8;
      }
      else {
        puVar18 = (uint *)ap_save->overflow_arg_area;
        ap_save->overflow_arg_area = puVar18 + 2;
      }
      aVar19._4_4_ = 0;
      aVar19._0_4_ = *puVar18;
    }
LAB_004c46c9:
    *paVar11 = aVar19;
    break;
  case FORMAT_DOUBLE:
    uVar24 = ap_save->fp_offset;
    if ((ulong)uVar24 < 0xa1) {
      paVar17 = (anon_union_8_4_dbbb708a_for_data *)((ulong)uVar24 + (long)ap_save->reg_save_area);
      ap_save->fp_offset = uVar24 + 0x10;
    }
    else {
      paVar17 = (anon_union_8_4_dbbb708a_for_data *)ap_save->overflow_arg_area;
      ap_save->overflow_arg_area = paVar17 + 1;
    }
    *paVar11 = *paVar17;
    break;
  case FORMAT_WIDTH:
    ((va_stack *)(paVar11 + -3))->type = FORMAT_INT;
  }
  paVar11 = paVar11 + 4;
  goto LAB_004c457c;
LAB_004c470a:
  ppcVar12 = endpos;
  local_15b8 = 0;
  local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
  iVar23 = 0;
  pcVar7 = format;
  do {
    while( true ) {
      while( true ) {
        local_15d0 = pcVar7;
        cVar2 = *format;
        if (cVar2 == '%') break;
        if (cVar2 == '\0') {
          return iVar23;
        }
        do {
          iVar3 = (*stream)((int)cVar2,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
          cVar2 = format[1];
          format = format + 1;
          pcVar7 = format;
        } while ((cVar2 != '\0') && (pcVar7 = format, cVar2 != '%'));
      }
      local_15d0 = format + 1;
      if (format[1] != '%') break;
      format = format + 2;
      local_15d0 = format;
      iVar3 = (*stream)(0x25,(FILE *)data);
      if (iVar3 == -1) {
        return iVar23;
      }
      iVar23 = iVar23 + 1;
      pcVar7 = local_15d0;
    }
    lVar8 = dprintf_DollarString(local_15d0,&local_15d0);
    uVar25 = lVar8 + -1;
    if (lVar8 == 0) {
      uVar25 = local_15b8;
    }
    uVar24 = vto[uVar25].flags;
    uVar26 = (ulong)uVar24;
    if ((uVar24 >> 0xe & 1) == 0) {
      local_15b8 = local_15b8 + 1;
      pcVar7 = (char *)vto[uVar25].width;
      pcVar22 = pcVar7;
    }
    else {
      pcVar7 = (char *)vto[uVar25].width;
      pcVar22 = vto[(long)pcVar7].data.str;
      local_15b8 = local_15b8 + 2;
      if ((long)pcVar22 < 0) {
        pcVar22 = (char *)-(long)pcVar22;
        uVar24 = uVar24 & 0xfffffefb | 4;
        uVar26 = (ulong)uVar24;
        vto[uVar25].flags = uVar24;
      }
    }
    uVar24 = (uint)uVar26;
    if ((uVar24 >> 0x10 & 1) == 0) {
      if ((short)uVar26 < 0) {
        pcVar13 = (char *)vto[uVar25].precision;
      }
      else {
        pcVar13 = (char *)0xffffffffffffffff;
      }
    }
    else {
      local_15b8 = local_15b8 + 1;
      pcVar13 = vto[vto[uVar25].precision].data.str;
      if ((long)vto[vto[uVar25].precision].data.str < 0) {
        pcVar13 = (char *)0xffffffffffffffff;
      }
    }
    iVar3 = iVar23;
    switch(vto[uVar25].type) {
    case FORMAT_STRING:
      local_15e8 = vto[uVar25].data.str;
      if (local_15e8 == (char *)0x0) {
        if (pcVar13 == (char *)0xffffffffffffffff || 4 < (long)pcVar13) {
          uVar26 = (ulong)(uVar24 & 0xfffffff7);
          vto[uVar25].flags = uVar24 & 0xfffffff7;
          local_15e8 = "(nil)";
          pcVar13 = (char *)0x5;
        }
        else {
          local_15e8 = "";
LAB_004c4ea2:
          pcVar13 = (char *)0x0;
        }
      }
      else if (pcVar13 == (char *)0xffffffffffffffff) {
        if (*local_15e8 == '\0') goto LAB_004c4ea2;
        pcVar13 = (char *)strlen(local_15e8);
      }
      pcVar7 = (char *)0x7fffffffffffffff;
      if (pcVar13 < (char *)0x7fffffffffffffff) {
        pcVar7 = pcVar13;
      }
      if ((uVar26 & 8) != 0) {
        iVar3 = (*stream)(0x22,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar23 = iVar23 + 1;
        uVar26 = (ulong)(uint)vto[uVar25].flags;
      }
      uVar14 = (long)pcVar22 - (long)pcVar7;
      uVar15 = uVar14;
      if ((uVar26 & 4) == 0) {
        uVar15 = ((long)uVar14 >> 0x3f & uVar14) - 1;
        for (; 0 < (long)uVar14; uVar14 = uVar14 - 1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      for (pcVar7 = (char *)0x0; iVar3 = (int)pcVar13, pcVar13 != pcVar7; pcVar7 = pcVar7 + 1) {
        iVar3 = (int)pcVar7;
        if (local_15e8[(long)pcVar7] == '\0') break;
        iVar4 = (*stream)((int)local_15e8[(long)pcVar7],(FILE *)data);
        if (iVar4 == -1) {
          return iVar23 + iVar3;
        }
      }
      iVar3 = iVar3 + iVar23;
      uVar24 = vto[uVar25].flags;
      if ((uVar24 & 4) != 0) {
        for (; 0 < (long)uVar15; uVar15 = uVar15 - 1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        uVar24 = vto[uVar25].flags;
      }
      if ((uVar24 & 8) != 0) {
        iVar23 = (*stream)(0x22,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
      break;
    case FORMAT_PTR:
      pcVar7 = vto[uVar25].data.str;
      if (pcVar7 != (char *)0x0) {
        local_15c0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
        if ((uVar24 >> 0xc & 1) == 0) {
          local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
        }
        uVar16 = 1;
LAB_004c4959:
        bVar27 = false;
        bVar21 = 1;
        uStack_1600 = 0x10;
        pcVar10 = pcVar7;
        goto LAB_004c4c62;
      }
      pcVar22 = pcVar22 + -5;
      pcVar7 = pcVar22;
      local_15c8 = stream;
      if ((uVar26 & 4) != 0) {
        uVar26 = (long)pcVar22 >> 0x3f & (ulong)pcVar22;
        for (; pcVar7 = (char *)(uVar26 - 1), 0 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
          iVar3 = (*stream)(0x20,(FILE *)data);
          if (iVar3 == -1) {
            return iVar23;
          }
          iVar23 = iVar23 + 1;
        }
      }
      iVar3 = iVar23 + 5;
      for (lVar8 = 0; stream = local_15c8, lVar8 != 5; lVar8 = lVar8 + 1) {
        iVar4 = (*local_15c8)((int)"(nil)"[lVar8],(FILE *)data);
        if (iVar4 == -1) {
          return iVar23 + (int)lVar8;
        }
      }
      if ((vto[uVar25].flags & 4) == 0) {
        for (; 0 < (long)pcVar7; pcVar7 = pcVar7 + -1) {
          iVar23 = (*stream)(0x20,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
      }
      break;
    case FORMAT_INT:
      pcVar7 = vto[uVar25].data.str;
      if ((uVar24 >> 0x11 & 1) == 0) {
        uVar16 = (uint)(uVar26 >> 3) & 1;
        pcVar10 = pcVar7;
        if ((uVar24 >> 10 & 1) == 0) {
          if ((uVar24 >> 0xb & 1) != 0) {
            local_15c0 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
            if ((uVar24 >> 0xc & 1) == 0) {
              local_15c0 = "0123456789abcdefghijklmnopqrstuvwxyz";
            }
            goto LAB_004c4959;
          }
          if ((uVar24 >> 9 & 1) != 0) {
            bVar27 = false;
            bVar21 = 0;
            uStack_1600 = 10;
            goto LAB_004c4c62;
          }
          pcVar10 = (char *)-(long)pcVar7;
          if (0 < (long)pcVar7) {
            pcVar10 = pcVar7;
          }
          bVar28 = -1 < (long)pcVar7;
          bVar27 = false;
          bVar21 = 0;
          uStack_1600 = 10;
        }
        else {
          bVar21 = 0;
          bVar27 = true;
          uStack_1600 = 8;
LAB_004c4c62:
          bVar28 = true;
        }
        lVar8 = 0;
        for (; pcVar10 != (char *)0x0; pcVar10 = (char *)((ulong)pcVar10 / uStack_1600)) {
          work[lVar8 + 0x144] = local_15c0[(ulong)pcVar10 % uStack_1600];
          lVar8 = lVar8 + -1;
        }
        if (pcVar13 == (char *)0xffffffffffffffff) {
          pcVar13 = &DAT_00000001;
        }
        pcVar13 = pcVar13 + lVar8;
        if ((bVar27 && uVar16 != 0) && ((long)pcVar13 < 1)) {
          work[lVar8 + 0x144] = '0';
          pcVar22 = pcVar22 + lVar8 + -1;
          lVar8 = lVar8 + 0x143;
        }
        else {
          pcVar22 = pcVar22 + lVar8;
          lVar8 = lVar8 + 0x144;
          pcVar7 = pcVar13;
          if (0 < (long)pcVar13) {
            for (; (0 < (long)pcVar7 && (-1 < lVar8)); lVar8 = lVar8 + -1) {
              work[lVar8] = '0';
              pcVar7 = pcVar7 + -1;
            }
            pcVar22 = pcVar22 + -(long)pcVar13;
          }
        }
        bVar21 = (byte)uVar16 & bVar21;
        local_15b0 = (char **)CONCAT44(local_15b0._4_4_,(uint)bVar21);
        pcVar7 = pcVar22 + -2;
        if (bVar21 == 0) {
          pcVar7 = pcVar22;
        }
        uVar14 = (long)pcVar7 - (ulong)(byte)(bVar28 ^ 1U | (uVar26 & 3) != 0);
        uVar15 = uVar14;
        local_15c8 = stream;
        if ((uVar26 & 0x104) == 0) {
          uVar26 = (long)uVar14 >> 0x3f & uVar14;
          for (; uVar15 = uVar26 - 1, iVar3 = iVar23, 0 < (long)uVar14; uVar14 = uVar14 - 1) {
            iVar3 = (*stream)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
        }
        if (bVar28 == false) {
          uStack_1600._0_4_ = 0x2d;
LAB_004c4dad:
          iVar23 = (*stream)((int)uStack_1600,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        else {
          if ((vto[uVar25].flags & 2U) != 0) {
            uStack_1600._0_4_ = 0x2b;
            goto LAB_004c4dad;
          }
          if ((vto[uVar25].flags & 1U) != 0) {
            uStack_1600._0_4_ = 0x20;
            goto LAB_004c4dad;
          }
        }
        if ((char)local_15b0 != '\0') {
          iVar23 = (*stream)(0x30,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          if ((vto[uVar25].flags & 0x1000) == 0) {
            uStack_1600._0_4_ = 0x78;
          }
          else {
            uStack_1600._0_4_ = 0x58;
          }
          iVar23 = (*stream)((int)uStack_1600,(FILE *)data);
          if (iVar23 == -1) {
            return iVar3 + 1;
          }
          iVar3 = iVar3 + 2;
        }
        uVar26 = uVar15;
        if ((vto[uVar25].flags & 0x104U) == 0x100) {
          uVar26 = ((long)uVar15 >> 0x3f & uVar15) - 1;
          for (; 0 < (long)uVar15; uVar15 = uVar15 - 1) {
            iVar23 = (*stream)(0x30,(FILE *)data);
            if (iVar23 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
          }
        }
        for (; lVar8 < 0x144; lVar8 = lVar8 + 1) {
          iVar23 = (*stream)((int)work[lVar8 + 1],(FILE *)data);
          if (iVar23 == -1) {
            return iVar3;
          }
          iVar3 = iVar3 + 1;
        }
        if ((vto[uVar25].flags & 4) != 0) {
          for (; 0 < (long)uVar26; uVar26 = uVar26 - 1) {
            iVar23 = (*stream)(0x20,(FILE *)data);
            if (iVar23 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
          }
        }
      }
      else {
        local_15c8 = stream;
        if ((uVar26 & 4) == 0) {
          for (; 1 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
            iVar3 = (*local_15c8)(0x20,(FILE *)data);
            if (iVar3 == -1) {
              return iVar23;
            }
            iVar23 = iVar23 + 1;
          }
          pcVar22 = pcVar22 + -1;
        }
        stream = local_15c8;
        iVar3 = (*local_15c8)((uint)pcVar7 & 0xff,(FILE *)data);
        if (iVar3 == -1) {
          return iVar23;
        }
        iVar3 = iVar23 + 1;
        if ((vto[uVar25].flags & 4) != 0) {
          for (; 1 < (long)pcVar22; pcVar22 = pcVar22 + -1) {
            iVar23 = (*stream)(0x20,(FILE *)data);
            if (iVar23 == -1) {
              return iVar3;
            }
            iVar3 = iVar3 + 1;
          }
        }
      }
      break;
    case FORMAT_INTPTR:
      if ((uVar26 & 0x40) != 0) {
        *(long *)vto[uVar25].data.str = (long)iVar23;
        goto switchD_004c4876_caseD_5;
      }
      if ((uVar26 & 0x20) == 0) {
        if ((uVar26 & 0x10) == 0) {
          *(int *)vto[uVar25].data.str = iVar23;
        }
        else {
          *(short *)vto[uVar25].data.str = (short)iVar23;
        }
      }
      else {
        *(long *)vto[uVar25].data.str = (long)iVar23;
      }
      break;
    default:
switchD_004c4876_caseD_5:
      break;
    case FORMAT_DOUBLE:
      formatbuf[0x10] = '\0';
      formatbuf[0x11] = '\0';
      formatbuf[0x12] = '\0';
      formatbuf[0x13] = '\0';
      formatbuf[0x14] = '\0';
      formatbuf[0x15] = '\0';
      formatbuf[0x16] = '\0';
      formatbuf[0x17] = '\0';
      formatbuf[0x18] = '\0';
      formatbuf[0x19] = '\0';
      formatbuf[0x1a] = '\0';
      formatbuf[0x1b] = '\0';
      formatbuf[0x1c] = '\0';
      formatbuf[0x1d] = '\0';
      formatbuf[0x1e] = '\0';
      formatbuf[0x1f] = '\0';
      formatbuf[0] = '%';
      formatbuf[1] = '\0';
      formatbuf[2] = '\0';
      formatbuf[3] = '\0';
      formatbuf[4] = '\0';
      formatbuf[5] = '\0';
      formatbuf[6] = '\0';
      formatbuf[7] = '\0';
      formatbuf[8] = '\0';
      formatbuf[9] = '\0';
      formatbuf[10] = '\0';
      formatbuf[0xb] = '\0';
      formatbuf[0xc] = '\0';
      formatbuf[0xd] = '\0';
      formatbuf[0xe] = '\0';
      formatbuf[0xf] = '\0';
      local_15c8 = stream;
      sVar9 = strlen(formatbuf);
      pcVar22 = pcVar7;
      if (((uVar24 >> 0xd & 1) == 0) &&
         (pcVar22 = (char *)0xffffffffffffffff, (uVar24 >> 0xe & 1) != 0)) {
        pcVar22 = vto[(long)pcVar7].data.str;
      }
      if ((short)uVar26 < 0) {
        paVar11 = (anon_union_8_4_dbbb708a_for_data *)&vto[uVar25].precision;
LAB_004c4a7a:
        pcVar7 = paVar11->str;
      }
      else {
        pcVar7 = (char *)0xffffffffffffffff;
        if ((uVar24 >> 0x10 & 1) != 0) {
          paVar11 = &vto[vto[uVar25].precision].data;
          goto LAB_004c4a7a;
        }
      }
      buffer = (byte *)(formatbuf + 1);
      if ((uVar26 & 4) != 0) {
        formatbuf[1] = '-';
        buffer = (byte *)(formatbuf + 2);
      }
      if ((uVar26 & 2) != 0) {
        *buffer = 0x2b;
        buffer = buffer + 1;
      }
      if ((uVar26 & 1) != 0) {
        *buffer = 0x20;
        buffer = buffer + 1;
        uVar26 = (ulong)(uint)vto[uVar25].flags;
      }
      if ((uVar26 & 8) != 0) {
        *buffer = 0x23;
        buffer = buffer + 1;
      }
      maxlength = 0x20 - sVar9;
      *buffer = 0;
      if (-1 < (long)pcVar22) {
        if ((char *)0x144 < pcVar22) {
          pcVar22 = (char *)0x145;
        }
        iVar23 = curl_msnprintf((char *)buffer,maxlength,"%ld",pcVar22);
        buffer = buffer + iVar23;
        maxlength = maxlength - (long)iVar23;
      }
      stream = local_15c8;
      if (-1 < (long)pcVar7) {
        lVar8 = 0x144 - (long)pcVar22;
        if ((long)pcVar22 < (long)pcVar7) {
          lVar8 = 0x144;
        }
        dVar1 = vto[uVar25].data.dnum;
        if ((long)pcVar22 < 1) {
          lVar8 = 0x144;
        }
        for (; 10.0 <= dVar1; dVar1 = dVar1 / 10.0) {
          lVar8 = lVar8 + -1;
        }
        pcVar22 = (char *)(lVar8 + -1);
        if ((long)pcVar7 <= lVar8) {
          pcVar22 = pcVar7;
        }
        if ((long)pcVar22 < 1) {
          pcVar22 = (char *)0x0;
        }
        iVar23 = curl_msnprintf((char *)buffer,maxlength,".%ld",pcVar22);
        buffer = buffer + iVar23;
      }
      uVar24 = vto[uVar25].flags;
      if ((uVar24 & 0x20) != 0) {
        *buffer = 0x6c;
        buffer = buffer + 1;
        uVar24 = vto[uVar25].flags;
      }
      if ((uVar24 >> 0x12 & 1) == 0) {
        bVar21 = 0x66;
        if ((uVar24 >> 0x13 & 1) != 0) {
          bVar21 = ((uVar24 >> 0xc & 1) == 0) << 5 | 0x47;
        }
      }
      else {
        bVar21 = ((uVar24 >> 0xc & 1) == 0) << 5 | 0x45;
      }
      *buffer = bVar21;
      buffer[1] = 0;
      pcVar7 = work;
      sprintf(pcVar7,formatbuf,SUB84(vto[uVar25].data,0));
      for (; *pcVar7 != '\0'; pcVar7 = pcVar7 + 1) {
        iVar23 = (*stream)((int)*pcVar7,(FILE *)data);
        if (iVar23 == -1) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
      }
    }
    format = *ppcVar12;
    ppcVar12 = ppcVar12 + 1;
    iVar23 = iVar3;
    pcVar7 = format;
  } while( true );
LAB_004c4265:
  if (lVar8 - 0x81U < 0xffffffffffffff80) {
    return 0;
  }
  lVar8 = lVar8 + -1;
  switch(bVar21) {
  case 99:
    vto[lVar8].type = FORMAT_INT;
    uVar16 = uVar16 | 0x20000;
    break;
  case 100:
  case 0x69:
    vto[lVar8].type = FORMAT_INT;
    break;
  case 0x65:
    vto[lVar8].type = FORMAT_DOUBLE;
    uVar16 = uVar16 | 0x40000;
    break;
  case 0x66:
    vto[lVar8].type = FORMAT_DOUBLE;
    break;
  case 0x67:
    vto[lVar8].type = FORMAT_DOUBLE;
    uVar16 = uVar16 | 0x80000;
    break;
  case 0x6e:
    vto[lVar8].type = FORMAT_INTPTR;
    break;
  case 0x6f:
    vto[lVar8].type = FORMAT_INT;
    uVar16 = uVar16 | 0x400;
    break;
  case 0x70:
    vto[lVar8].type = FORMAT_PTR;
    break;
  case 0x73:
switchD_004c429a_caseD_73:
    vto[lVar8].type = FORMAT_STRING;
    break;
  case 0x75:
    vto[lVar8].type = FORMAT_INT;
    uVar16 = uVar16 | 0x200;
    break;
  case 0x78:
    vto[lVar8].type = FORMAT_INT;
    uVar16 = uVar16 | 0xa00;
    break;
  default:
    if (bVar21 == 0x45) {
      vto[lVar8].type = FORMAT_DOUBLE;
      uVar16 = uVar16 | 0x41000;
      break;
    }
    if (bVar21 == 0x47) {
      vto[lVar8].type = FORMAT_DOUBLE;
      uVar16 = uVar16 | 0x81000;
      break;
    }
    if (bVar21 == 0x58) {
      vto[lVar8].type = FORMAT_INT;
      uVar16 = uVar16 | 0x1a00;
      break;
    }
    if (bVar21 == 0x53) {
      uVar16 = uVar16 | 8;
      goto switchD_004c429a_caseD_73;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    vto[lVar8].type = FORMAT_UNKNOWN;
  }
  vto[lVar8].flags = uVar16;
  vto[lVar8].width = lVar5;
  vto[lVar8].precision = local_15e0;
  if ((uVar16 >> 0xe & 1) != 0) {
    uVar25 = lVar5 - 1;
    if (0x7f < uVar25) {
      return 0;
    }
    vto[lVar8].width = uVar25;
    vto[uVar25].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[uVar25].flags = 0;
    *(undefined8 *)((long)&vto[uVar25].width + 4) = 0;
    *(undefined4 *)((long)&vto[uVar25].precision + 4) = 0;
  }
  if ((uVar16 >> 0x10 & 1) != 0) {
    uVar25 = local_15e0 - 1;
    if (0x7f < uVar25) {
      return 0;
    }
    vto[lVar8].precision = uVar25;
    vto[uVar25].type = FORMAT_WIDTH;
    *(undefined8 *)&vto[uVar25].flags = 0;
    *(undefined8 *)((long)&vto[uVar25].width + 4) = 0;
    *(undefined4 *)((long)&vto[uVar25].precision + 4) = 0;
  }
  *local_15b0 = (char *)((work._0_8_ + 1) - (ulong)(*(char *)work._0_8_ == '\0'));
  ppcVar12 = local_15b0 + 1;
  stream = local_15c8;
  goto LAB_004c4022;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num = 0; /* parameter counter */

  struct va_stack vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;
  char work[BUFFSIZE];
  struct va_stack *p;

  /* 'workend' points to the final buffer byte position, but with an extra
     byte as margin to avoid the (false?) warning Coverity gives us
     otherwise */
  char *workend = &work[sizeof(work) - 2];

  /* Do the actual %-code parsing */
  if(dprintf_Pass1(format, vto, endpos, ap_save))
    return 0;

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    unsigned long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    char *w;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param = dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM) {
      width = (long)vto[p->width].data.num.as_signed;
      param_num++; /* since the width is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(width < 0) {
        /* "A negative field width is taken as a '-' flag followed by a
           positive field width." */
        width = -width;
        p->flags |= FLAGS_LEFT;
        p->flags &= ~FLAGS_PAD_NIL;
      }
    }
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extracted from a parameter, we
                      must skip that to get to the next one properly */
      if(prec < 0)
        /* "A negative precision is taken as if the precision were
           omitted." */
        prec = -1;
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch(p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }
      else if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */

      /* Supply a default precision if none was given.  */
      if(prec == -1)
        prec = 1;

      /* Put the number in WORK.  */
      w = workend;
      while(num > 0) {
        *w-- = digits[num % base];
        num /= base;
      }
      width -= (long)(workend - w);
      prec -= (long)(workend - w);

      if(is_alt && base == 8 && prec <= 0) {
        *w-- = '0';
        --width;
      }

      if(prec > 0) {
        width -= prec;
        while(prec-- > 0 && w >= work)
          *w-- = '0';
      }

      if(is_alt && base == 16)
        width -= 2;

      if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
        --width;

      if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR(' ');

      if(is_neg)
        OUTCHAR('-');
      else if(p->flags & FLAGS_SHOWSIGN)
        OUTCHAR('+');
      else if(p->flags & FLAGS_SPACE)
        OUTCHAR(' ');

      if(is_alt && base == 16) {
        OUTCHAR('0');
        if(p->flags & FLAGS_UPPER)
          OUTCHAR('X');
        else
          OUTCHAR('x');
      }

      if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
        while(width-- > 0)
          OUTCHAR('0');

      /* Write the number.  */
      while(++w <= workend) {
        OUTCHAR(*w);
      }

      if(p->flags & FLAGS_LEFT)
        while(width-- > 0)
          OUTCHAR(' ');
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(!str) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else if(prec != -1)
          len = (size_t)prec;
        else if(*str == '\0')
          len = 0;
        else
          len = strlen(str);

        width -= (len > LONG_MAX) ? LONG_MAX : (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        for(; len && *str; len--)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(!(p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr = &formatbuf[1];
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          *fptr++ = '-';
        if(p->flags & FLAGS_SHOWSIGN)
          *fptr++ = '+';
        if(p->flags & FLAGS_SPACE)
          *fptr++ = ' ';
        if(p->flags & FLAGS_ALT)
          *fptr++ = '#';

        *fptr = 0;

        if(width >= 0) {
          if(width >= (long)sizeof(work))
            width = sizeof(work)-1;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* for each digit in the integer part, we can have one less
             precision */
          size_t maxprec = sizeof(work) - 2;
          double val = p->data.dnum;
          if(width > 0 && prec <= width)
            maxprec -= width;
          while(val >= 10.0) {
            val /= 10;
            maxprec--;
          }

          if(prec > (long)maxprec)
            prec = (long)maxprec-1;
          if(prec < 0)
            prec = 0;
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final null-termination */

#ifdef __clang__
#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wformat-nonliteral"
#endif
        /* NOTE NOTE NOTE!! Not all sprintf implementations return number of
           output characters */
#ifdef HAVE_SNPRINTF
        (snprintf)(work, sizeof(work), formatbuf, p->data.dnum);
#else
        (sprintf)(work, formatbuf, p->data.dnum);
#endif
#ifdef __clang__
#pragma clang diagnostic pop
#endif
        DEBUGASSERT(strlen(work) <= sizeof(work));
        for(fptr = work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}